

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O0

void conf_set_int(Conf *conf,int primary,int value)

{
  conf_entry *entry_00;
  conf_entry *entry;
  int value_local;
  int primary_local;
  Conf *conf_local;
  
  entry_00 = (conf_entry *)safemalloc(1,0x18,0);
  if (subkeytypes[primary] != 0) {
    __assert_fail("subkeytypes[primary] == TYPE_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x1a5,"void conf_set_int(Conf *, int, int)");
  }
  if (valuetypes[primary] == 2) {
    (entry_00->key).primary = primary;
    (entry_00->value).u.intval = value;
    conf_insert(conf,entry_00);
    return;
  }
  __assert_fail("valuetypes[primary] == TYPE_INT",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                0x1a6,"void conf_set_int(Conf *, int, int)");
}

Assistant:

void conf_set_int(Conf *conf, int primary, int value)
{
    struct conf_entry *entry = snew(struct conf_entry);

    assert(subkeytypes[primary] == TYPE_NONE);
    assert(valuetypes[primary] == TYPE_INT);
    entry->key.primary = primary;
    entry->value.u.intval = value;
    conf_insert(conf, entry);
}